

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_impl.h
# Opt level: O2

void __thiscall packet::PacketT<TestConfig>::setupState(PacketT<TestConfig> *this,State state)

{
  this->reading_state_ = state;
  (*(code *)(&DAT_00106014 + *(int *)(&DAT_00106014 + (ulong)state * 4)))();
  return;
}

Assistant:

inline void
PacketT<Cfg>::setupState(const State state)
{
  reading_state_ = state;
  switch (reading_state_) {
    case State::HEAD_PATTERN: {
      buffer_part_ = BufferPart(&buffer_, 0, HEAD_PATTERN_SIZE);
      break;
    }
    case State::DATA_SIZE: {
      buffer_part_ = BufferPart(&buffer_, current_data_idx_, sizeof(data_len_t));
      break;
    }
    case State::DATA: {
      pkt_data_len_ = ntohl((*buffer_part_.parseAs<data_len_t>()));
      buffer_part_ = BufferPart(&buffer_, current_data_idx_, pkt_data_len_);
      break;
    }
    case State::TAIL_PATTERN: {
      buffer_part_ = BufferPart(&buffer_, current_data_idx_, TAIL_PATTERN_SIZE);
      break;
    }
    case State::NONE: {
      buffer_part_ = BufferPart();
      break;
    }
  }
}